

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

lbool __thiscall Gluco::Solver::search(Solver *this,int nof_conflicts)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  int64_t iVar6;
  bool bVar7;
  CRef confl;
  Lit p;
  int *piVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  uint8_t uVar12;
  uint uVar13;
  int level;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  float fVar18;
  CRef cr;
  vec<Gluco::Lit> local_d8;
  ClauseAllocator *local_c0;
  vec<Gluco::Lit> local_b8;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  uint local_90;
  uint szWoutSelectors;
  uint nblevels;
  int backtrack_level;
  vec<unsigned_int> *local_80;
  int *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  bqueue<unsigned_int> *local_40;
  bqueue<unsigned_int> *local_38;
  
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x410,"lbool Gluco::Solver::search(int)");
  }
  local_d8.data = (Lit *)0x0;
  local_d8.sz = 0;
  local_d8.cap = 0;
  local_b8.data = (Lit *)0x0;
  local_b8.sz = 0;
  local_b8.cap = 0;
  this->starts = this->starts + 1;
  piVar1 = &(this->trail).sz;
  local_38 = &this->trailQueue;
  local_78 = &(this->lbdQueue).first;
  local_40 = &this->lbdQueue;
  local_c0 = &this->ca;
  local_80 = &this->learnts;
  local_a0 = 0;
  do {
    while (confl = propagate(this), confl != 0xffffffff) {
      lVar16 = this->conflicts + 1;
      this->conflicts = lVar16;
      this->conflictsRestarts = this->conflictsRestarts + 1;
      if (((lVar16 * -0x2d77318fc504816f + 0x346dc5d6388658U >> 3 |
           lVar16 * -0x2d77318fc504816f << 0x3d) < 0xd1b71758e2197) && (this->var_decay < 0.95)) {
        this->var_decay = this->var_decay + 0.01;
      }
      if ((0 < this->verbosity) && (lVar16 % (long)this->verbEveryConflicts == 0)) {
        local_a8 = this->starts;
        local_48 = lVar16 / (long)local_a8;
        piVar8 = piVar1;
        if ((this->trail_lim).sz != 0) {
          piVar8 = (this->trail_lim).data;
        }
        local_90 = (uint)this->nbstopsrestarts;
        iVar6 = this->dec_vars;
        iVar3 = *piVar8;
        local_94 = (this->clauses).sz;
        local_50 = (ulong)(uint)this->clauses_literals;
        local_58 = (ulong)(uint)this->nbReduceDB;
        local_60 = (ulong)(uint)(this->learnts).sz;
        local_70 = (ulong)(uint)this->nbRemovedClauses;
        local_68 = (ulong)(uint)this->nbDL2;
        dVar17 = progressEstimate(this);
        printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n",
               dVar17 * 100.0,local_a8,(ulong)local_90,local_48,(ulong)(uint)((int)iVar6 - iVar3),
               (ulong)local_94,local_50,local_58,local_60,local_68,local_70);
      }
      if ((this->trail_lim).sz == 0) {
LAB_005c39cc:
        uVar12 = '\x01';
        goto LAB_005c39e7;
      }
      bqueue<unsigned_int>::push(local_38,(this->trail).sz);
      if (((10000 < this->conflictsRestarts) &&
          ((this->lbdQueue).queuesize == (this->lbdQueue).maxsize)) &&
         ((double)((this->trailQueue).sumofqueue / (ulong)(long)(this->trailQueue).queuesize &
                  0xffffffff) * this->R < (double)(this->trail).sz)) {
        (this->lbdQueue).queuesize = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        *(uint64_t *)(local_78 + 2) = 0;
        this->nbstopsrestarts = this->nbstopsrestarts + 1;
        piVar8 = local_78;
        if ((local_a0 & 1) == 0) {
          piVar8 = (int *)this->starts;
          this->lastblockatrestart = (int64_t)piVar8;
          this->nbstopsrestartssame = this->nbstopsrestartssame + 1;
        }
        local_a0 = CONCAT71((int7)((ulong)piVar8 >> 8),1);
      }
      if (local_d8.data != (Lit *)0x0) {
        local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
      }
      if (local_b8.data != (Lit *)0x0) {
        local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
      }
      analyze(this,confl,&local_d8,&local_b8,&backtrack_level,&nblevels,&szWoutSelectors);
      uVar13 = nblevels;
      uVar15 = (ulong)nblevels;
      bqueue<unsigned_int>::push(local_40,nblevels);
      this->sumLBD = (float)uVar15 + this->sumLBD;
      cancelUntil(this,backtrack_level);
      if (this->certifiedUNSAT == true) {
        local_a8 = uVar15;
        if (0 < local_d8.sz) {
          lVar16 = 0;
          do {
            uVar11 = local_d8.data[lVar16].x >> 1;
            uVar13 = ~uVar11;
            if ((local_d8.data[lVar16].x & 1U) == 0) {
              uVar13 = uVar11 + 1;
            }
            fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar13);
            lVar16 = lVar16 + 1;
          } while (lVar16 < local_d8.sz);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
        uVar13 = (uint)local_a8;
      }
      if (local_d8.sz == 1) {
        uncheckedEnqueue(this,(Lit)(local_d8.data)->x,0xffffffff);
        this->nbUn = this->nbUn + 1;
      }
      else {
        cr = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>(local_c0,&local_d8,true);
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) {
LAB_005c3a48:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        *(ulong *)(puVar4 + cr) =
             *(ulong *)(puVar4 + cr) & 0xffffffff8000001f | (ulong)((uVar13 & 0x3ffffff) << 5);
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) goto LAB_005c3a48;
        (local_c0->super_RegionAllocator<unsigned_int>).memory[(ulong)cr + 2] = szWoutSelectors;
        if (uVar13 < 3) {
          this->nbDL2 = this->nbDL2 + 1;
        }
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) goto LAB_005c3a48;
        if ((local_c0->super_RegionAllocator<unsigned_int>).memory[(ulong)cr + 1] == 2) {
          this->nbBin = this->nbBin + 1;
        }
        vec<unsigned_int>::push(local_80,&cr);
        attachClause(this,cr);
        uVar15 = (ulong)cr;
        uVar13 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
        if (uVar13 <= cr) goto LAB_005c3a48;
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((*(ulong *)(puVar4 + uVar15) & 8) == 0) {
LAB_005c3a67:
          __assert_fail("header.has_extra",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SolverTypes.h"
                        ,0xc4,"float &Gluco::Clause::activity()");
        }
        uVar10 = *(ulong *)(puVar4 + uVar15) >> 0x20;
        dVar17 = this->cla_inc;
        fVar18 = (float)((double)(float)puVar4[uVar15 + uVar10 + 3] + dVar17);
        puVar4[uVar15 + uVar10 + 3] = (uint)fVar18;
        if (1e+20 < fVar18) {
          lVar16 = (long)(this->learnts).sz;
          if (0 < lVar16) {
            puVar4 = local_80->data;
            puVar5 = (local_c0->super_RegionAllocator<unsigned_int>).memory;
            lVar14 = 0;
            do {
              uVar11 = puVar4[lVar14];
              if (uVar13 <= uVar11) goto LAB_005c3a48;
              if ((*(ulong *)(puVar5 + uVar11) & 8) == 0) goto LAB_005c3a67;
              uVar15 = *(ulong *)(puVar5 + uVar11) >> 0x20;
              puVar5[(ulong)uVar11 + uVar15 + 3] =
                   (uint)((float)puVar5[(ulong)uVar11 + uVar15 + 3] * 1e-20);
              lVar14 = lVar14 + 1;
            } while (lVar16 != lVar14);
          }
          this->cla_inc = dVar17 * 1e-20;
        }
        uncheckedEnqueue(this,(Lit)(local_d8.data)->x,cr);
      }
      this->var_inc = (1.0 / this->var_decay) * this->var_inc;
      this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
    }
    if ((((this->conflictsRestarts != 0) &&
         (iVar3 = (this->lbdQueue).queuesize, iVar3 == (this->lbdQueue).maxsize)) &&
        ((double)(this->sumLBD / (float)this->conflictsRestarts) <
         (double)((this->lbdQueue).sumofqueue / (ulong)(long)iVar3 & 0xffffffff) * this->K)) ||
       ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) {
      (this->lbdQueue).queuesize = 0;
      local_78[0] = 0;
      local_78[1] = 0;
      *(uint64_t *)(local_78 + 2) = 0;
      dVar17 = progressEstimate(this);
      this->progress_estimate = dVar17;
      iVar3 = (this->trail_lim).sz;
      level = (this->assumptions).sz;
      if (iVar3 < level) {
        level = iVar3;
      }
      if (this->incremental == 0) {
        level = 0;
      }
      uVar12 = '\x02';
      cancelUntil(this,level);
      goto LAB_005c39e7;
    }
    if (((this->trail_lim).sz == 0) && (bVar7 = simplify(this), !bVar7)) goto LAB_005c39cc;
    if (this->curRestart * (long)this->nbclausesbeforereduce <= this->conflicts) {
      if ((this->learnts).sz < 1) {
        __assert_fail("learnts.size()>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x46a,"lbool Gluco::Solver::search(int)");
      }
      this->curRestart = this->conflicts / (long)this->nbclausesbeforereduce + 1;
      reduceDB(this);
      this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->incReduceDB;
    }
    while (iVar3 = (this->trail_lim).sz, iVar3 < (this->assumptions).sz) {
      p.x = (this->assumptions).data[iVar3].x;
      bVar2 = (this->assigns).data[p.x >> 1].value;
      bVar9 = (byte)p.x & 1;
      if (bVar2 != bVar9) {
        if ((bVar2 ^ bVar9) == 1) {
          uVar12 = '\x01';
          analyzeFinal(this,(Lit)(p.x ^ 1),&this->conflict);
          goto LAB_005c39e7;
        }
        if (p.x != 0xfffffffe) goto LAB_005c341c;
        break;
      }
      cr = *piVar1;
      vec<int>::push(&this->trail_lim,(int *)&cr);
    }
    this->decisions = this->decisions + 1;
    p = pickBranchLit(this);
    if (p.x == -2) {
      uVar12 = '\0';
LAB_005c39e7:
      if (local_b8.data != (Lit *)0x0) {
        local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
        free(local_b8.data);
      }
      if (local_d8.data != (Lit *)0x0) {
        local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
        free(local_d8.data);
      }
      return (lbool)uVar12;
    }
LAB_005c341c:
    cr = *piVar1;
    vec<int>::push(&this->trail_lim,(int *)&cr);
    uncheckedEnqueue(this,p,0xffffffff);
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause,selectors;
    unsigned int nblevels,szWoutSelectors;
    bool blocked=false;
    starts++;
    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
          conflicts++; conflictC++;conflictsRestarts++;
          if(conflicts%5000==0 && var_decay<0.95)
            var_decay += 0.01;

          if (verbosity >= 1 && conflicts%verbEveryConflicts==0){
            printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n", 
                   (int)starts,(int)nbstopsrestarts, (int)(conflicts/starts), 
                   (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                   (int)nbReduceDB, nLearnts(), (int)nbDL2,(int)nbRemovedClauses, progressEstimate()*100);
          }
          if (decisionLevel() == 0) {
            return l_False;
            
          }

          trailQueue.push(trail.size());
          // BLOCK RESTART (CP 2012 paper)
          if( conflictsRestarts>LOWER_BOUND_FOR_BLOCKING_RESTART && lbdQueue.isvalid()  && trail.size()>R*trailQueue.getavg()) {
            lbdQueue.fastclear();
            nbstopsrestarts++;
            if(!blocked) {lastblockatrestart=starts;nbstopsrestartssame++;blocked=true;}
          }

            learnt_clause.clear();
            selectors.clear();
            analyze(confl, learnt_clause, selectors,backtrack_level,nblevels,szWoutSelectors);

            lbdQueue.push(nblevels);
            sumLBD += nblevels;
 
            cancelUntil(backtrack_level);

            if (certifiedUNSAT) {
              for (int i = 0; i < learnt_clause.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(learnt_clause[i]) + 1) *
                            (-2 * sign(learnt_clause[i]) + 1) );
              fprintf(certifiedOutput, "0\n");
            }

            if (learnt_clause.size() == 1){
              uncheckedEnqueue(learnt_clause[0]);nbUn++;
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                ca[cr].setLBD(nblevels); 
                ca[cr].setSizeWithoutSelectors(szWoutSelectors);
                if(nblevels<=2) nbDL2++; // stats
                if(ca[cr].size()==2) nbBin++; // stats
                learnts.push(cr);
                attachClause(cr);

                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }
            varDecayActivity();
            claDecayActivity();

           
        }else{

          // Our dynamic restart, see the SAT09 competition compagnion paper 
          if ( (conflictsRestarts && lbdQueue.isvalid() && lbdQueue.getavg()*K > sumLBD/conflictsRestarts) || (pstop && *pstop) ) {
            lbdQueue.fastclear();
            progress_estimate = progressEstimate();
            int bt = 0;
            if(incremental) { // DO NOT BACKTRACK UNTIL 0.. USELESS
              bt = (decisionLevel()<assumptions.size()) ? decisionLevel() : assumptions.size();
            }
            cancelUntil(bt);
            return l_Undef; 
          }

           // Simplify the set of problem clauses:
          if (decisionLevel() == 0 && !simplify()) {
            return l_False;
          }
            // Perform clause database reduction !
            if(conflicts>=curRestart* nbclausesbeforereduce) 
              {
                  
                assert(learnts.size()>0);
                curRestart = (conflicts/ nbclausesbeforereduce)+1;
                reduceDB();
                nbclausesbeforereduce += incReduceDB;
              }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef){
                  //printf("c last restart ## conflicts  :  %d %d \n",conflictC,decisionLevel());
                  // Model found:
                  return l_True;
                }
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}